

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaCuFunc.cpp
# Opt level: O0

void __thiscall NaCustomFunc::Function(NaCustomFunc *this,NaReal *x,NaReal *y)

{
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x70) == 0) {
    NaPrintLog("Dummy Function(): external function is not linked!\n");
    if ((in_RDX != (undefined8 *)0x0) && (in_RSI != (undefined8 *)0x0)) {
      *in_RDX = *in_RSI;
    }
  }
  else {
    (**(code **)(**(long **)(in_RDI + 0x70) + 0x30))(*(long **)(in_RDI + 0x70),in_RSI,in_RDX);
  }
  return;
}

Assistant:

void
NaCustomFunc::Function (NaReal* x, NaReal* y)
{
  if(NULL == exfunc){
    NaPrintLog("Dummy Function(): external function is not linked!\n");
    if(NULL != y && NULL != x)
      *y  = *x;
    return;
  }

  exfunc->Function(x, y);
}